

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Parent * __thiscall
kj::_::BTreeImpl::eraseHelper<kj::_::BTreeImpl::Parent>
          (BTreeImpl *this,Parent *node,Parent *parent,uint indexInParent,uint pos,MaybeUint **fixup
          )

{
  uint i;
  Parent *pPVar1;
  MaybeUint *pMVar2;
  uint uVar3;
  NodeUnion *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  void *pvVar12;
  void *__ptr;
  Fault f;
  Fault local_38;
  
  if (parent == (Parent *)0x0) {
    return node;
  }
  if (node->keys[3].i != 0) {
    return node;
  }
  __ptr = (void *)(ulong)pos;
  if (indexInParent == 0) {
    uVar3 = parent->keys[0].i;
    if (uVar3 == 0) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                 ,0x24f,FAILED,(char *)0x0,"\"inconsistent b-tree\"",
                 (char (*) [20])"inconsistent b-tree");
      Debug::Fault::fatal(&local_38);
    }
    pvVar12 = (void *)(ulong)parent->children[1];
    pPVar1 = (Parent *)(this->tree + (long)pvVar12);
    if (this->tree[(long)pvVar12].field_0.freelist.zero[3] != 0) {
      rotateLeft(this,node,pPVar1,parent,0,fixup);
      return node;
    }
    pMVar2 = parent->keys;
    node->keys[3].i = uVar3;
    node->keys[6].i = pPVar1->keys[2].i;
    *(undefined8 *)(node->keys + 4) = *(undefined8 *)pPVar1->keys;
    uVar5 = *(undefined8 *)(pPVar1->children + 2);
    *(undefined8 *)(node->children + 4) = *(undefined8 *)pPVar1->children;
    *(undefined8 *)(node->children + 6) = uVar5;
    uVar5 = *(undefined8 *)(parent->keys + 3);
    *(undefined8 *)(parent->keys + 4) = *(undefined8 *)(parent->keys + 5);
    *(undefined8 *)pMVar2 = *(undefined8 *)(parent->keys + 1);
    *(undefined8 *)(parent->keys + 2) = uVar5;
    parent->keys[6].i = 0;
    *(undefined8 *)(parent->children + 5) = *(undefined8 *)(parent->children + 6);
    *(undefined8 *)(parent->children + 1) = *(undefined8 *)(parent->children + 2);
    *(undefined8 *)(parent->children + 3) = *(undefined8 *)(parent->children + 4);
    parent->children[7] = 0;
    free(this,pvVar12);
    if (*fixup == pMVar2) {
      *fixup = (MaybeUint *)0x0;
    }
    if (pMVar2->i != 0) {
      return node;
    }
    pNVar4 = this->tree;
    uVar5 = *(undefined8 *)node;
    uVar6 = *(undefined8 *)(node->keys + 1);
    uVar7 = *(undefined8 *)(node->keys + 3);
    uVar8 = *(undefined8 *)(node->keys + 5);
    uVar9 = *(undefined8 *)node->children;
    uVar10 = *(undefined8 *)(node->children + 2);
    uVar11 = *(undefined8 *)(node->children + 6);
    *(undefined8 *)((long)&pNVar4->field_0 + 0x30) = *(undefined8 *)(node->children + 4);
    *(undefined8 *)((long)&pNVar4->field_0 + 0x38) = uVar11;
    *(undefined8 *)((long)&pNVar4->field_0 + 0x20) = uVar9;
    *(undefined8 *)((long)&pNVar4->field_0 + 0x28) = uVar10;
    *(undefined8 *)((long)&pNVar4->field_0 + 0x10) = uVar7;
    *(undefined8 *)((long)&pNVar4->field_0 + 0x18) = uVar8;
    *(undefined8 *)&pNVar4->field_0 = uVar5;
    *(undefined8 *)((long)&pNVar4->field_0 + 8) = uVar6;
  }
  else {
    i = indexInParent - 1;
    pvVar12 = (void *)(ulong)parent->children[i];
    pPVar1 = (Parent *)(this->tree + (long)pvVar12);
    if (this->tree[(long)pvVar12].field_0.freelist.zero[3] != 0) {
      rotateRight(this,pPVar1,node,parent,i);
      return node;
    }
    pPVar1->keys[3].i = parent->keys[i].i;
    *(undefined8 *)(pPVar1->keys + 4) = *(undefined8 *)node->keys;
    pPVar1->keys[6].i = node->keys[2].i;
    uVar5 = *(undefined8 *)(node->children + 2);
    *(undefined8 *)(pPVar1->children + 4) = *(undefined8 *)node->children;
    *(undefined8 *)(pPVar1->children + 6) = uVar5;
    Parent::eraseAfter(parent,i);
    free(this,__ptr);
    if (*fixup == parent->keys + indexInParent) {
      *fixup = *fixup + -1;
    }
    if (parent->keys[0].i != 0) {
      return pPVar1;
    }
    pNVar4 = this->tree;
    uVar5 = *(undefined8 *)pPVar1;
    uVar6 = *(undefined8 *)(pPVar1->keys + 1);
    uVar7 = *(undefined8 *)(pPVar1->keys + 3);
    uVar8 = *(undefined8 *)(pPVar1->keys + 5);
    uVar9 = *(undefined8 *)pPVar1->children;
    uVar10 = *(undefined8 *)(pPVar1->children + 2);
    uVar11 = *(undefined8 *)(pPVar1->children + 6);
    *(undefined8 *)((long)&pNVar4->field_0 + 0x30) = *(undefined8 *)(pPVar1->children + 4);
    *(undefined8 *)((long)&pNVar4->field_0 + 0x38) = uVar11;
    *(undefined8 *)((long)&pNVar4->field_0 + 0x20) = uVar9;
    *(undefined8 *)((long)&pNVar4->field_0 + 0x28) = uVar10;
    *(undefined8 *)((long)&pNVar4->field_0 + 0x10) = uVar7;
    *(undefined8 *)((long)&pNVar4->field_0 + 0x18) = uVar8;
    *(undefined8 *)&pNVar4->field_0 = uVar5;
    *(undefined8 *)((long)&pNVar4->field_0 + 8) = uVar6;
    __ptr = pvVar12;
  }
  free(this,__ptr);
  this->height = this->height - 1;
  return (Parent *)this->tree;
}

Assistant:

Node& BTreeImpl::eraseHelper(
    Node& node, Parent* parent, uint indexInParent, uint pos, MaybeUint*& fixup) {
  if (parent != nullptr && !node.isMostlyFull()) {
    // This is not the root, but it's only half-full. Rebalance.
    KJ_DASSERT(node.isHalfFull());

    if (indexInParent > 0) {
      // There's a sibling to the left.
      uint sibPos = parent->children[indexInParent - 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Left sibling is more than half full. Steal one member.
        rotateRight(sib, node, *parent, indexInParent - 1);
        return node;
      } else {
        // Left sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(sib, sibPos, *parent->keys[indexInParent - 1], node);
        parent->eraseAfter(indexInParent - 1);
        free(pos);
        if (fixup == &parent->keys[indexInParent]) --fixup;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, sib);
          free(sibPos);
          --height;
          return tree[0];
        } else {
          return sib;
        }
      }
    } else if (indexInParent < Parent::NKEYS && parent->keys[indexInParent] != nullptr) {
      // There's a sibling to the right.
      uint sibPos = parent->children[indexInParent + 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Right sibling is more than half full. Steal one member.
        rotateLeft(node, sib, *parent, indexInParent, fixup);
        return node;
      } else {
        // Right sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(node, pos, *parent->keys[indexInParent], sib);
        parent->eraseAfter(indexInParent);
        free(sibPos);
        if (fixup == &parent->keys[indexInParent]) fixup = nullptr;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, node);
          free(pos);
          --height;
          return tree[0];
        } else {
          return node;
        }
      }
    } else {
      KJ_FAIL_ASSERT("inconsistent b-tree");
    }
  }

  return node;
}